

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

bool __thiscall Am_Object::Is_Instance_Of(Am_Object *this,Am_Object *in_prototype)

{
  Am_Object_Data *local_28;
  Am_Object_Data *current;
  Am_Object *in_prototype_local;
  Am_Object *this_local;
  
  local_28 = this->data;
  while( true ) {
    if (local_28 == (Am_Object_Data *)0x0) {
      return false;
    }
    if (local_28 == in_prototype->data) break;
    local_28 = local_28->prototype;
  }
  return true;
}

Assistant:

bool
Am_Object::Is_Instance_Of(Am_Object in_prototype) const
{
  Am_Object_Data *current = data;
  while (current) {
    if (current == in_prototype.data)
      return true;
    current = current->prototype;
  }
  return false;
}